

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

spvc_result
spvc_compiler_get_active_buffer_ranges
          (spvc_compiler compiler,spvc_variable_id id,spvc_buffer_range **ranges,size_t *num_ranges)

{
  BufferRange *pBVar1;
  uint uVar2;
  spvc_context psVar3;
  size_t sVar4;
  size_t sVar5;
  _Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_> _Var6;
  BufferRange *pBVar7;
  SmallVector<spvc_buffer_range,_8UL> translated;
  SmallVector<spirv_cross::BufferRange,_8UL> active_ranges;
  undefined1 local_1e0 [216];
  undefined1 local_108 [216];
  
  spirv_cross::Compiler::get_active_buffer_ranges
            ((SmallVector<spirv_cross::BufferRange,_8UL> *)local_108,
             (compiler->compiler)._M_t.
             super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
             ._M_t.
             super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
             .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl,(VariableID)id);
  local_1e0._8_8_ = 0;
  local_1e0._16_8_ = 8;
  local_1e0._0_8_ = (spvc_buffer_range *)(local_1e0 + 0x18);
  spirv_cross::SmallVector<spvc_buffer_range,_8UL>::reserve
            ((SmallVector<spvc_buffer_range,_8UL> *)local_1e0,local_108._8_8_);
  if (local_108._8_8_ != 0) {
    pBVar1 = (BufferRange *)(local_108._0_8_ + local_108._8_8_ * 0x18);
    pBVar7 = (BufferRange *)local_108._0_8_;
    do {
      uVar2 = pBVar7->index;
      sVar4 = pBVar7->offset;
      sVar5 = pBVar7->range;
      spirv_cross::SmallVector<spvc_buffer_range,_8UL>::reserve
                ((SmallVector<spvc_buffer_range,_8UL> *)local_1e0,local_1e0._8_8_ + 1);
      ((spvc_buffer_range *)(local_1e0._0_8_ + local_1e0._8_8_ * 0x18))->index = uVar2;
      ((spvc_buffer_range *)(local_1e0._0_8_ + local_1e0._8_8_ * 0x18))->offset = sVar4;
      (&((spvc_buffer_range *)(local_1e0._0_8_ + local_1e0._8_8_ * 0x18))->offset)[1] = sVar5;
      local_1e0._8_8_ = local_1e0._8_8_ + 1;
      pBVar7 = pBVar7 + 1;
    } while (pBVar7 != pBVar1);
  }
  _Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
       (_Head_base<0UL,_ScratchMemoryAllocation_*,_false>)operator_new(0xe0);
  memset((undefined8 *)
         ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x20),0
         ,0xc0);
  *(undefined ***)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
       &PTR__TemporaryBuffer_0048fc00;
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 **)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8) =
       (undefined8 *)
       ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x20);
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x18) = 8;
  spirv_cross::SmallVector<spvc_buffer_range,_8UL>::operator=
            ((SmallVector<spvc_buffer_range,_8UL> *)
             ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8),
             (SmallVector<spvc_buffer_range,_8UL> *)local_1e0);
  *ranges = *(spvc_buffer_range **)
             ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8);
  *num_ranges = *(size_t *)
                 ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
                 0x10);
  psVar3 = compiler->context;
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
  ::reserve(&psVar3->allocations,
            (psVar3->allocations).
            super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
            .buffer_size + 1);
  sVar4 = (psVar3->allocations).
          super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
          .buffer_size;
  (psVar3->allocations).
  super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
  .ptr[sVar4]._M_t.
  super___uniq_ptr_impl<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>._M_t
  .super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>.
  super__Head_base<0UL,_ScratchMemoryAllocation_*,_false> =
       _Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl;
  (psVar3->allocations).
  super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
  .buffer_size = sVar4 + 1;
  local_1e0._8_8_ = 0;
  if ((spvc_buffer_range *)local_1e0._0_8_ != (spvc_buffer_range *)(local_1e0 + 0x18)) {
    free((void *)local_1e0._0_8_);
  }
  local_108._8_8_ = 0;
  if ((BufferRange *)local_108._0_8_ != (BufferRange *)(local_108 + 0x18)) {
    free((void *)local_108._0_8_);
  }
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_active_buffer_ranges(spvc_compiler compiler,
                                                   spvc_variable_id id,
                                                   const spvc_buffer_range **ranges,
                                                   size_t *num_ranges)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto active_ranges = compiler->compiler->get_active_buffer_ranges(id);
		SmallVector<spvc_buffer_range> translated;
		translated.reserve(active_ranges.size());
		for (auto &r : active_ranges)
		{
			spvc_buffer_range trans = { r.index, r.offset, r.range };
			translated.push_back(trans);
		}

		auto ptr = spvc_allocate<TemporaryBuffer<spvc_buffer_range>>();
		ptr->buffer = std::move(translated);
		*ranges = ptr->buffer.data();
		*num_ranges = ptr->buffer.size();
		compiler->context->allocations.push_back(std::move(ptr));
	}